

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

void __thiscall
ParamListStandard::forceNoUse(ParamListStandard *this,ParamActive *active,int4 start,int4 stop)

{
  ParamEntry *pPVar1;
  long lVar2;
  pointer pPVar3;
  bool bVar4;
  int4 i;
  byte bVar6;
  int iVar7;
  bool bVar5;
  
  if (start < stop) {
    pPVar3 = (active->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
             super__Vector_impl_data._M_start + start;
    lVar2 = (long)stop - (long)start;
    iVar7 = -1;
    bVar5 = false;
    bVar4 = false;
    bVar6 = 0;
    do {
      pPVar1 = pPVar3->entry;
      if (pPVar1 != (ParamEntry *)0x0) {
        if ((iVar7 < pPVar1->group) || (pPVar1->alignment != 0)) {
          bVar4 = bVar5;
          if ((bVar6 & 1) != 0) {
            bVar4 = true;
          }
          bVar6 = (byte)pPVar3->flags >> 2;
          iVar7 = pPVar1->groupsize + pPVar1->group + -1;
          bVar5 = bVar4;
        }
        else {
          bVar6 = bVar6 & (char)((char)pPVar3->flags << 5) >> 7;
        }
        if (bVar4) {
          pPVar3->flags = (pPVar3->flags & 0xfffffff6) + 1;
        }
      }
      pPVar3 = pPVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void ParamListStandard::forceNoUse(ParamActive *active, int4 start, int4 stop) const

{
  bool seendefnouse = false;
  int4 curgroup = -1;
  bool exclusion = false;
  bool alldefnouse = false;
  for (int4 i = start; i < stop; ++i) {
    ParamTrial &curtrial(active->getTrial(i));
    if (curtrial.getEntry() == (const ParamEntry *) 0)
      continue;	// Already marked as not used
    int4 grp = curtrial.getEntry()->getGroup();
    exclusion = curtrial.getEntry()->isExclusion();
    if ((grp <= curgroup) && exclusion) {// If in the same exclusion group
      if (!curtrial.isDefinitelyNotUsed()) // A single element that might be used
	alldefnouse = false; // means that the whole group might be used
    }
    else { // First trial in a new group (or next element in same non-exclusion group)
      if (alldefnouse)	   // If all in the last group were defnotused
	seendefnouse = true;// then force everything afterword to be defnotused
      alldefnouse = curtrial.isDefinitelyNotUsed();
      curgroup = grp + curtrial.getEntry()->getGroupSize() - 1;
    }
    if (seendefnouse)
      curtrial.markInactive();
  }
}